

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void __thiscall vsencoding::BitsWriter::bit_writer(BitsWriter *this,uint32_t value,uint32_t bits)

{
  uint32_t *puVar1;
  uint32_t bits_local;
  uint32_t value_local;
  BitsWriter *this_local;
  
  if (bits != 0) {
    this->buffer = this->buffer << ((byte)bits & 0x3f) |
                   (ulong)value & (1L << ((byte)bits & 0x3f)) - 1U;
    this->Fill = bits + this->Fill;
    if (0x1f < this->Fill) {
      puVar1 = this->data;
      this->data = puVar1 + 1;
      *puVar1 = (uint32_t)(this->buffer >> ((char)this->Fill - 0x20U & 0x3f));
      this->written = this->written + 1;
      this->Fill = this->Fill - 0x20;
    }
  }
  return;
}

Assistant:

inline void BitsWriter::bit_writer(uint32_t value, uint32_t bits) {
  if (bits == 0)
    return;

  buffer = (buffer << bits) | (value & ((1ULL << bits) - 1));

  Fill += bits;

  if (Fill >= 32) {
    *data++ = (buffer >> (Fill - 32)) & ((1ULL << 32) - 1);
    written++;
    Fill -= 32;
  }
}